

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * cargo_get_usage(cargo_t ctx,cargo_usage_t flags)

{
  cargo_group_t *grp;
  byte bVar1;
  char cVar2;
  size_t sVar3;
  cargo_opt_t *pcVar4;
  cargo_t pcVar5;
  cargo_group_t *pcVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  cargo_free_f p_Var13;
  uint max_name_len;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  cargo_usage_t in_stack_ffffffffffffff48;
  char *opt_s;
  char *local_98;
  size_t local_90;
  cargo_astr_t str;
  char *b;
  char *b_1;
  cargo_astr_t local_50;
  
  b = (char *)0x0;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x15da,"const char *cargo_get_usage(cargo_t, cargo_usage_t)");
  }
  if ((flags & CARGO_USAGE_HIDE_SHORT) == CARGO_USAGE_FULL) {
    b_1 = (char *)0x0;
    _cargo_add_help_if_missing(ctx);
    _cargo_add_orphans_to_default_group(ctx);
    local_50.diff = 0;
    local_50.l = 0;
    local_50.offset = 0;
    pcVar12 = ctx->progname;
    local_50.s = &b_1;
    if ((flags >> 8 & 1) == 0) {
      pcVar10 = strrchr(pcVar12,0x2f);
      if ((pcVar10 == (char *)0x0) && (pcVar10 = strrchr(pcVar12,0x5c), pcVar10 == (char *)0x0)) {
        pcVar10 = pcVar12;
      }
      sVar11 = strspn(pcVar10,"/\\");
      pcVar12 = pcVar10 + sVar11;
    }
    cargo_aappendf(&local_50,"Usage: %s",pcVar12);
    if (-1 < (char)flags) {
      local_90 = local_50.offset;
      _cargo_get_short_option_usages(ctx,&local_50,local_50.offset,0);
      opt_s = (char *)0x0;
      if (ctx->mutex_group_count != 0) {
        uVar17 = 0;
        sVar15 = 0;
        do {
          pcVar6 = ctx->mutex_groups;
          if ((pcVar6[uVar17].flags & 0x30) == 0) {
            if (pcVar6[uVar17].metavar == (char *)0x0) {
              if (((pcVar6[uVar17].flags & 4) == 0) &&
                 (uVar16 = pcVar6[uVar17].opt_count, uVar16 != 0)) {
                uVar18 = 0;
                do {
                  bVar1 = (byte)pcVar6[uVar17].flags;
                  local_98 = (char *)CONCAT71(local_98._1_7_,bVar1);
                  str.l = 0;
                  str.offset = 0;
                  str.diff = 0;
                  str.s = &opt_s;
                  sVar3 = pcVar6[uVar17].option_indices[uVar18];
                  pcVar4 = ctx->options;
                  if (uVar18 == 0) {
                    pcVar12 = " {";
                    if ((bVar1 & 1) == 0) {
                      pcVar12 = " [";
                    }
                    cargo_aappendf(&str,"%s",pcVar12);
                  }
                  iVar9 = _cargo_get_short_option_usage
                                    (ctx,pcVar4 + sVar3,&str,pcVar4[sVar3].positional,0);
                  if (iVar9 < 0) goto LAB_0010772f;
                  if (uVar18 == uVar16 - 1) {
                    pcVar12 = "}";
                    if (((ulong)local_98 & 1) == 0) {
                      pcVar12 = "]";
                    }
                    cargo_aappendf(&str,"%s",pcVar12);
                  }
                  else {
                    cargo_aappendf(&str,", ");
                  }
                  sVar3 = local_50.offset;
                  if (ctx->max_width <= (local_50.offset - sVar15) + str.offset) {
                    cargo_aappendf(&local_50,"\n%*s",local_90," ");
                    sVar15 = sVar3;
                  }
                  if ((opt_s != (char *)0x0) &&
                     (cargo_aappendf(&local_50,"%s"), opt_s != (char *)0x0)) {
                    if (replaced_cargo_free == (cargo_free_f)0x0) {
                      free(opt_s);
                    }
                    else {
                      (*replaced_cargo_free)(opt_s);
                    }
                    opt_s = (char *)0x0;
                  }
                  uVar18 = uVar18 + 1;
                  uVar16 = pcVar6[uVar17].opt_count;
                } while (uVar18 < uVar16);
              }
            }
            else {
              str.l = 0;
              str.offset = 0;
              str.diff = 0;
              str.s = &opt_s;
              cargo_aappendf(&str," %s",pcVar6[uVar17].metavar);
              sVar3 = local_50.offset;
              if (ctx->max_width <= (local_50.offset - sVar15) + str.offset) {
                cargo_aappendf(&local_50,"\n%*s",local_90," ");
                sVar15 = sVar3;
              }
              if ((opt_s != (char *)0x0) && (cargo_aappendf(&local_50,"%s"), opt_s != (char *)0x0))
              {
                if (replaced_cargo_free == (cargo_free_f)0x0) {
                  free(opt_s);
                }
                else {
                  (*replaced_cargo_free)(opt_s);
                }
                opt_s = (char *)0x0;
              }
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < ctx->mutex_group_count);
      }
LAB_0010772f:
      _cargo_get_short_option_usages(ctx,&local_50,local_90,1);
    }
    if (replaced_cargo_realloc == (cargo_realloc_f)0x0) {
      pcVar12 = (char *)realloc(b_1,local_50.offset + 1);
    }
    else {
      pcVar12 = (char *)(*replaced_cargo_realloc)(b_1,local_50.offset + 1);
    }
    if (pcVar12 == (char *)0x0) {
      return (char *)0x0;
    }
    pcVar10 = ctx->short_usage;
    b_1 = pcVar12;
    if (pcVar10 == (char *)0x0) {
      ctx->short_usage = pcVar12;
    }
    else {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(pcVar10);
      }
      else {
        (*replaced_cargo_free)(pcVar10);
      }
      ctx->short_usage = b_1;
      pcVar12 = b_1;
      if (b_1 == (char *)0x0) {
        return (char *)0x0;
      }
    }
  }
  else {
    pcVar12 = (char *)0x0;
  }
  if ((flags & CARGO_USAGE_SHORT) != CARGO_USAGE_FULL) {
    return pcVar12;
  }
  sVar11 = ctx->max_width;
  if (sVar11 != 0) {
    if (replaced_cargo_malloc == (cargo_malloc_f)0x0) {
      pcVar10 = (char *)malloc(sVar11);
    }
    else {
      pcVar10 = (char *)(*replaced_cargo_malloc)(sVar11);
    }
    if (pcVar10 != (char *)0x0) {
      uVar17 = ctx->opt_count;
      if (uVar17 == 0) {
        max_name_len = 0;
        bVar23 = true;
        local_90 = CONCAT71(local_90._1_7_,1);
      }
      else {
        lVar19 = 0;
        lVar22 = 0;
        lVar14 = 0;
        max_name_len = 0;
        uVar16 = 0;
        local_98 = pcVar12;
        do {
          pcVar4 = ctx->options;
          if ((*(byte *)((long)&pcVar4->flags + lVar19) & 0x20) == 0) {
            iVar9 = *(int *)((long)pcVar4->mutex_group_idxs + lVar19 + -0x18);
            lVar20 = lVar22;
            if (iVar9 == 0) {
              lVar20 = lVar14;
            }
            lVar21 = lVar20 + 1;
            if (iVar9 != 0) {
              lVar21 = lVar14;
              lVar22 = lVar20 + 1;
            }
            uVar8 = _cargo_get_option_name_str
                              (ctx,(cargo_opt_t *)((long)pcVar4->name + lVar19),pcVar10,
                               ctx->max_width);
            lVar14 = lVar21;
            if ((int)uVar8 < 0) {
              max_name_len = 0xffffffff;
              break;
            }
            uVar7 = max_name_len;
            if ((int)max_name_len < (int)uVar8) {
              uVar7 = uVar8;
            }
            if (uVar8 < 0x29) {
              max_name_len = uVar7;
            }
            uVar17 = ctx->opt_count;
          }
          uVar16 = uVar16 + 1;
          lVar19 = lVar19 + 0x128;
        } while (uVar16 < uVar17);
        bVar23 = lVar22 == 0;
        local_90 = CONCAT71(local_90._1_7_,lVar14 == 0);
        pcVar12 = local_98;
      }
      p_Var13 = replaced_cargo_free;
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(pcVar10);
      }
      else {
        (*replaced_cargo_free)(pcVar10);
      }
      if (-1 < (int)max_name_len) {
        str.s = &b;
        str.l = 0x400;
        str.offset = 0;
        if (((flags & CARGO_USAGE_HIDE_SHORT) == CARGO_USAGE_FULL) && (pcVar12 != (char *)0x0)) {
          cargo_aappendf(&str,"%s\n",pcVar12);
        }
        pcVar5 = (cargo_t)ctx->description;
        if (((pcVar5 == (cargo_t)0x0) ||
            ((flags & CARGO_USAGE_HIDE_DESCRIPTION) != CARGO_USAGE_FULL)) ||
           (*(char *)&pcVar5->progname == '\0')) {
LAB_00107995:
          uVar17 = ctx->mutex_group_count;
          if (uVar17 != 0) {
            lVar22 = 0;
            uVar16 = 0;
            do {
              iVar9 = (int)p_Var13;
              pcVar6 = ctx->mutex_groups;
              if ((*(byte *)((long)&pcVar6->flags + lVar22) & 2) != 0) {
                if (*(long *)((long)&pcVar6->title + lVar22) != 0) {
                  cargo_aappendf(&str,"\n%s:\n");
                }
                iVar9 = _cargo_get_group_description
                                  (ctx,&str,(cargo_group_t *)((long)&pcVar6->name + lVar22),iVar9);
                if ((iVar9 != 0) ||
                   (iVar9 = _cargo_print_options
                                      (ctx,*(size_t **)((long)&pcVar6->option_indices + lVar22),
                                       *(size_t *)((long)&pcVar6->opt_count + lVar22),1,&str,
                                       max_name_len,1,flags,in_stack_ffffffffffffff48), iVar9 != 0))
                goto LAB_00107c48;
                p_Var13 = (cargo_free_f)0x0;
                iVar9 = _cargo_print_options
                                  (ctx,*(size_t **)((long)&pcVar6->option_indices + lVar22),
                                   *(size_t *)((long)&pcVar6->opt_count + lVar22),0,&str,
                                   max_name_len,1,flags,in_stack_ffffffffffffff48);
                if (iVar9 != 0) goto LAB_00107c48;
                uVar17 = ctx->mutex_group_count;
              }
              uVar16 = uVar16 + 1;
              lVar22 = lVar22 + 0x48;
            } while (uVar16 < uVar17);
          }
          if (ctx->group_count != 0) {
            lVar22 = 0;
            uVar17 = 0;
            do {
              pcVar6 = ctx->groups;
              if (((*(byte *)((long)&pcVar6->flags + lVar22) & 1) == 0) &&
                 (*(long *)((long)&pcVar6->opt_count + lVar22) != 0)) {
                grp = (cargo_group_t *)((long)&pcVar6->name + lVar22);
                cVar2 = *grp->name;
                local_98 = (char *)CONCAT71(local_98._1_7_,cVar2);
                if (cVar2 != '\0') {
                  cargo_aappendf(&str,"\n%s:",*(undefined8 *)((long)&pcVar6->title + lVar22));
                }
                if (*(long *)((long)&pcVar6->description + lVar22) != 0) {
                  cargo_aappendf(&str,"\n");
                }
                iVar9 = _cargo_get_group_description(ctx,&str,grp,(int)p_Var13);
                if (iVar9 != 0) goto LAB_00107c48;
                if (!bVar23) {
                  if (((char)local_98 == '\0') &&
                     (iVar9 = cargo_aappendf(&str,"Positional arguments:\n"), iVar9 < 0))
                  goto LAB_00107c48;
                  p_Var13 = (cargo_free_f)0x1;
                  iVar9 = _cargo_print_options
                                    (ctx,*(size_t **)((long)&pcVar6->option_indices + lVar22),
                                     *(size_t *)((long)&pcVar6->opt_count + lVar22),1,&str,
                                     max_name_len,0,flags,in_stack_ffffffffffffff48);
                  if (iVar9 != 0) goto LAB_00107c48;
                }
                iVar9 = cargo_aappendf(&str,"\n");
                if (iVar9 < 0) goto LAB_00107c48;
                if ((char)local_90 == '\0') {
                  if (((char)local_98 == '\0') &&
                     (iVar9 = cargo_aappendf(&str,"Options:\n"), iVar9 < 0)) goto LAB_00107c48;
                  p_Var13 = (cargo_free_f)0x0;
                  iVar9 = _cargo_print_options
                                    (ctx,*(size_t **)((long)&pcVar6->option_indices + lVar22),
                                     *(size_t *)((long)&pcVar6->opt_count + lVar22),0,&str,
                                     max_name_len,0,flags,in_stack_ffffffffffffff48);
                  if (iVar9 != 0) goto LAB_00107c48;
                }
              }
              uVar17 = uVar17 + 1;
              lVar22 = lVar22 + 0x48;
            } while (uVar17 < ctx->group_count);
          }
          pcVar5 = (cargo_t)ctx->epilog;
          pcVar12 = b;
          if (((pcVar5 == (cargo_t)0x0) || ((flags & CARGO_USAGE_HIDE_EPILOG) != CARGO_USAGE_FULL))
             || (*(char *)&pcVar5->progname == '\0')) goto LAB_00107c73;
          if ((flags & CARGO_USAGE_RAW_EPILOG) == CARGO_USAGE_FULL) {
            pcVar12 = _cargo_linebreak(pcVar5,(char *)ctx->max_width,(size_t)pcVar5);
            if (pcVar12 != (char *)0x0) {
              cargo_aappendf(&str,"\n%s\n",pcVar12);
              if (replaced_cargo_free == (cargo_free_f)0x0) {
                free(pcVar12);
                pcVar12 = b;
              }
              else {
                (*replaced_cargo_free)(pcVar12);
                pcVar12 = b;
              }
              goto LAB_00107c73;
            }
          }
          else {
            iVar9 = cargo_aappendf(&str,"\n%s\n");
            pcVar12 = b;
            if (-1 < iVar9) goto LAB_00107c73;
          }
        }
        else if ((flags & CARGO_USAGE_RAW_DESCRIPTION) == CARGO_USAGE_FULL) {
          pcVar12 = _cargo_linebreak(pcVar5,(char *)ctx->max_width,(size_t)pcVar5);
          if (pcVar12 != (char *)0x0) {
            cargo_aappendf(&str,"\n%s\n",pcVar12);
            if (replaced_cargo_free == (cargo_free_f)0x0) {
              free(pcVar12);
            }
            else {
              (*replaced_cargo_free)(pcVar12);
            }
            goto LAB_00107995;
          }
        }
        else {
          iVar9 = cargo_aappendf(&str,"\n%s\n");
          if (-1 < iVar9) goto LAB_00107995;
        }
      }
    }
  }
LAB_00107c48:
  if (b != (char *)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(b);
    }
    else {
      (*replaced_cargo_free)(b);
    }
    b = (char *)0x0;
  }
  pcVar12 = (char *)0x0;
LAB_00107c73:
  pcVar10 = ctx->usage;
  if (pcVar10 != (char *)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(pcVar10);
    }
    else {
      (*replaced_cargo_free)(pcVar10);
    }
  }
  ctx->usage = pcVar12;
  return pcVar12;
}

Assistant:

const char *cargo_get_usage(cargo_t ctx, cargo_usage_t flags)
{
    char *ret = NULL;
    size_t i;
    char *b = NULL;
    int max_name_len = 0;
    size_t positional_count = 0;
    size_t option_count = 0;
    const char *short_usage = NULL;
    cargo_group_t *grp = NULL;
    cargo_astr_t str;
    int is_default_group = 1;
    assert(ctx);

    if (!(flags & CARGO_USAGE_HIDE_SHORT))
    {
        if (!(short_usage = _cargo_get_short_usage(ctx, flags)))
        {
            CARGODBG(1, "Failed to get short usage\n");
            return NULL;
        }
    }

    // Only show short usage.
    if (flags & CARGO_USAGE_SHORT)
    {
        return short_usage;
    }

    // TODO: Instead of looping over all options at this stage, save the length
    // of all options on add_option, including max_length, positional_count and
    // so on.

    // First get option names and their length.
    // We get the widest one so we know the column width to use
    // for the final result.
    //   --option_a         Some description.
    //   --longer_option_b  Another description...
    // ^-------------------^
    // What should the above width be.
    if ((max_name_len = _cargo_get_max_name_length(ctx,
                        &positional_count, &option_count)) < 0)
    {
        CARGODBG(1, "Failed to get option name max length\n");
        goto fail;
    }

    str.s = &b;
    str.l = 1024;
    str.offset = 0;

    // TODO: Break all this into separate functions.

    if (short_usage && !(flags & CARGO_USAGE_HIDE_SHORT))
    {
        cargo_aappendf(&str, "%s\n", short_usage);
    }

    if(ctx->description && strlen(ctx->description)
       && !(flags & CARGO_USAGE_HIDE_DESCRIPTION))
    {
        if (flags & CARGO_USAGE_RAW_DESCRIPTION)
        {
            if (cargo_aappendf(&str, "\n%s\n", ctx->description) < 0) goto fail;
        }
        else
        {
            char *lb_desc;
            if (!(lb_desc = _cargo_linebreak(ctx, ctx->description, ctx->max_width)))
            {
                goto fail;
            }
            cargo_aappendf(&str, "\n%s\n", lb_desc);
            _cargo_free(lb_desc);
        }
    }

    CARGODBG(2, "max_name_len = %d, ctx->max_width = %lu\n",
            max_name_len, ctx->max_width);

    #ifdef CARGO_DEBUG
    for (i = 0; i < ctx->group_count; i++)
    {
        CARGODBG(2, "%s: %lu\n",
            ctx->groups[i].name, ctx->groups[i].opt_count);
    }
    #endif

    // Start by printing mutually exclusive groups
    for (i = 0; i < ctx->mutex_group_count; i++)
    {
        int indent = 2;
        const char *description = NULL;
        grp = &ctx->mutex_groups[i];

        if (!(grp->flags & CARGO_MUTEXGRP_GROUP_USAGE))
        {
            continue;
        }

        if (grp->title)
        {
            cargo_aappendf(&str, "\n%s:\n", grp->title);
        }

        description = grp->description;

        if (!description)
        {
            description = "Specify one of the following.";
        }

        if (_cargo_get_group_description(ctx, &str, grp, indent))
        {
            goto fail;
        }

        // Positional.
        if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                1, &str, max_name_len, indent, 1, flags))
        {
            goto fail;
        }

        // Options.
        if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                0, &str, max_name_len, indent, 1, flags))
        {
            goto fail;
        }
    }

    for (i = 0; i < ctx->group_count; i++)
    {
        int indent = 2;
        grp = &ctx->groups[i];

        if ((grp->flags & CARGO_GROUP_HIDE) || (grp->opt_count == 0))
        {
            continue;
        }

        // The group name is always set for normal groups.
        // The default group is simply "".
        is_default_group = (strlen(grp->name) == 0);

        if (!is_default_group)
        {
            indent = 2;
        }

        if (!is_default_group) cargo_aappendf(&str, "\n%s:", grp->title);
        if (grp->description) cargo_aappendf(&str, "\n");

        if (_cargo_get_group_description(ctx, &str, grp, indent))
        {
            goto fail;
        }

        // Note, we only show the "Positional arguments" and "Options"
        // titles for the default group. It becomes quite spammy otherwise.
        if (positional_count > 0)
        {
            if (is_default_group)
                if (cargo_aappendf(&str, "Positional arguments:\n") < 0) goto fail;

            if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                    1, &str, max_name_len, indent, 0, flags))
            {
                goto fail;
            }
        }

        if (cargo_aappendf(&str, "\n") < 0) goto fail;

        if (option_count > 0)
        {
            if (is_default_group)
                if (cargo_aappendf(&str, "Options:\n") < 0) goto fail;

            if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                    0, &str, max_name_len, indent, 0, flags))
            {
                goto fail;
            }
        }
    }

    if(ctx->epilog && strlen(ctx->epilog)
       && !(flags & CARGO_USAGE_HIDE_EPILOG))
    {
        if (flags & CARGO_USAGE_RAW_EPILOG)
        {
            if (cargo_aappendf(&str, "\n%s\n", ctx->epilog) < 0) goto fail;
        }
        else
        {
            char *lb_epilog;
            if (!(lb_epilog = _cargo_linebreak(ctx, ctx->epilog, ctx->max_width)))
            {
                goto fail;
            }
            cargo_aappendf(&str, "\n%s\n", lb_epilog);
            _cargo_free(lb_epilog);
        }
    }

    // TODO: Realloc the buffer to minimize size.

    ret = b;

fail:
    // A real failure!
    if (!ret)
    {
        _cargo_xfree(&b);
    }

    // Save the usage and destroy it on exit,
    // we want the user to be able to do things like this:
    // printf("%s\nYou're bad at typing!\n", cargo_get_usage(cargo, 0));
    // without leaking memory.
    _cargo_xfree(&ctx->usage);

    ctx->usage = ret;

    return ret;
}